

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O2

int rsa_verify_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                   size_t sig_len)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = mbedtls_rsa_get_len((mbedtls_rsa_context *)ctx);
  iVar1 = -16000;
  if (((md_alg != MBEDTLS_MD_NONE || hash_len >> 0x20 == 0) && (iVar1 = -0x4380, sVar2 <= sig_len))
     && (iVar1 = mbedtls_rsa_pkcs1_verify
                           ((mbedtls_rsa_context *)ctx,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                            (void *)0x0,0,md_alg,(uint)hash_len,hash,sig), iVar1 == 0)) {
    iVar1 = 0;
    if (sVar2 < sig_len) {
      iVar1 = -0x3900;
    }
  }
  return iVar1;
}

Assistant:

static int rsa_verify_wrap( void *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   const unsigned char *sig, size_t sig_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_rsa_context * rsa = (mbedtls_rsa_context *) ctx;
    size_t rsa_len = mbedtls_rsa_get_len( rsa );

#if SIZE_MAX > UINT_MAX
    if( md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
#endif /* SIZE_MAX > UINT_MAX */

    if( sig_len < rsa_len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_rsa_pkcs1_verify( rsa, NULL, NULL,
                                  MBEDTLS_RSA_PUBLIC, md_alg,
                                  (unsigned int) hash_len, hash, sig ) ) != 0 )
        return( ret );

    /* The buffer contains a valid signature followed by extra data.
     * We have a special error code for that so that so that callers can
     * use mbedtls_pk_verify() to check "Does the buffer start with a
     * valid signature?" and not just "Does the buffer contain a valid
     * signature?". */
    if( sig_len > rsa_len )
        return( MBEDTLS_ERR_PK_SIG_LEN_MISMATCH );

    return( 0 );
}